

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O1

int json_pointer_setf(json_object **obj,json_object *value,char *path_fmt,...)

{
  char *pcVar1;
  char in_AL;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *path_copy;
  json_pointer_get_result res;
  va_list args;
  char *local_120;
  json_pointer_get_result local_118;
  undefined8 local_f8;
  char **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_120 = (char *)0x0;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (obj == (json_object **)0x0 || path_fmt == (char *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    return -1;
  }
  local_e8 = local_d8;
  local_f0 = &path_copy;
  local_f8 = 0x3000000018;
  iVar2 = vasprintf(&local_120,path_fmt,&local_f8);
  pcVar1 = local_120;
  if (iVar2 < 0) {
    return iVar2;
  }
  if (*local_120 == '/') {
    pcVar3 = strrchr(local_120,0x2f);
    if (pcVar3 == pcVar1) {
      local_118.obj = *obj;
    }
    else {
      *pcVar3 = '\0';
      iVar2 = json_pointer_result_get_recursive(*obj,local_120,&local_118);
      if (iVar2 != 0) goto LAB_0010a5d7;
    }
    iVar2 = json_pointer_set_single_path
                      (local_118.obj,pcVar3 + 1,value,json_object_array_put_idx_cb,(void *)0x0);
  }
  else if (*local_120 == '\0') {
    json_object_put(*obj);
    *obj = value;
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    iVar2 = -1;
  }
LAB_0010a5d7:
  free(local_120);
  return iVar2;
}

Assistant:

int json_pointer_setf(struct json_object **obj, struct json_object *value, const char *path_fmt,
                      ...)
{
	char *endp;
	char *path_copy = NULL;
	struct json_object *set = NULL;
	va_list args;
	int rc = 0;

	if (!obj || !path_fmt)
	{
		errno = EINVAL;
		return -1;
	}

	/* pass a working copy to the recursive call */
	va_start(args, path_fmt);
	rc = vasprintf(&path_copy, path_fmt, args);
	va_end(args);

	if (rc < 0)
		return rc;

	if (path_copy[0] == '\0')
	{
		json_object_put(*obj);
		*obj = value;
		goto out;
	}

	if (path_copy[0] != '/')
	{
		errno = EINVAL;
		rc = -1;
		goto out;
	}

	/* If there's only 1 level to set, stop here */
	if ((endp = strrchr(path_copy, '/')) == path_copy)
	{
		set = *obj;
		goto set_single_path;
	}

	*endp = '\0';
	rc = json_pointer_object_get_recursive(*obj, path_copy, &set);

	if (rc)
		goto out;

set_single_path:
	endp++;
	rc = json_pointer_set_single_path(set, endp, value,
					  json_object_array_put_idx_cb, NULL);
out:
	free(path_copy);
	return rc;
}